

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O3

Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::getNextEvent_abi_cxx11_
          (Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  int iVar3;
  yaml_event_t event;
  size_type *local_b8;
  size_type local_b0;
  size_type sStack_a8;
  undefined8 uStack_a0;
  string local_98;
  yaml_event_t local_78;
  
  iVar3 = yaml_parser_parse(&this->parser_,&local_78);
  if (iVar3 == 0) {
    format_abi_cxx11_(&local_98,"Error parsing yaml %d@%d: %s",
                      (ulong)(uint)(this->parser_).problem_mark.line,
                      (ulong)(uint)(this->parser_).problem_mark.column,(this->parser_).problem);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      sStack_a8 = local_98.field_2._8_8_;
      local_98._M_dataplus._M_p = (pointer)&local_b0;
    }
    psVar2 = &(__return_storage_ptr__->field_0).value_.value._M_string_length;
    *(size_type **)&__return_storage_ptr__->field_0 = psVar2;
    if ((size_type *)local_98._M_dataplus._M_p == &local_b0) {
      *psVar2 = local_98.field_2._M_allocated_capacity;
      (__return_storage_ptr__->field_0).value_.value.field_2._M_allocated_capacity = sStack_a8;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_98._M_dataplus._M_p;
      (__return_storage_ptr__->field_0).value_.value._M_string_length =
           local_98.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).value_.value._M_dataplus._M_p =
         (pointer)local_98._M_string_length;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    if (local_78.type != YAML_SCALAR_EVENT) {
      local_78.data.document_start.tag_directives.end = (yaml_tag_directive_t *)"";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,(char *)local_78.data.scalar.value,(allocator<char> *)&local_98);
    (__return_storage_ptr__->field_0).value_.type = local_78.type;
    paVar1 = &(__return_storage_ptr__->field_0).value_.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&__return_storage_ptr__->field_0 + 8) = paVar1;
    if (local_b8 == &sStack_a8) {
      paVar1->_M_allocated_capacity = sStack_a8;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).value_.value.field_2 + 8) = uStack_a0
      ;
    }
    else {
      (__return_storage_ptr__->field_0).value_.value._M_dataplus._M_p = (pointer)local_b8;
      (__return_storage_ptr__->field_0).value_.value.field_2._M_allocated_capacity = sStack_a8;
    }
    (__return_storage_ptr__->field_0).value_.value._M_string_length = local_b0;
    __return_storage_ptr__->has_value_ = true;
    yaml_event_delete(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<YamlEvent, std::string> getNextEvent() {
		yaml_event_t event;
		if (!yaml_parser_parse(&parser_, &event)) {
			return Unexpected(format("Error parsing yaml %d@%d: %s",
				(int)parser_.problem_mark.line, (int)parser_.problem_mark.column,
				parser_.problem));
		}
		using YamlEventPtr = std::unique_ptr<yaml_event_t, decltype(&yaml_event_delete)>;
		const auto event_holder = YamlEventPtr(&event, &yaml_event_delete);

		return YamlEvent(event);
	}